

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

bool __thiscall
duckdb::BitpackingState<long,_long>::Flush<duckdb::EmptyBitpackingWriter>
          (BitpackingState<long,_long> *this)

{
  byte width;
  byte bVar1;
  bitpacking_width_t width_00;
  idx_t iVar2;
  bool bVar3;
  
  bVar3 = true;
  if (this->compression_buffer_idx != 0) {
    if (((this->all_invalid == false) && (this->maximum != this->minimum)) ||
       (1 < (byte)(this->mode - AUTO))) {
      CalculateFORStats(this);
      CalculateDeltaStats(this);
      if (this->can_do_delta == true) {
        if ((this->maximum_delta == this->minimum_delta) && ((this->mode & ~AUTO) != DELTA_FOR)) {
          this->total_size = this->total_size + 0x14;
          return true;
        }
        width = BitpackingPrimitives::MinimumBitWidth<long,false>(this->min_max_delta_diff);
        bVar1 = BitpackingPrimitives::MinimumBitWidth<long,true>(this->min_max_diff);
        if ((width < bVar1) && (this->mode != FOR)) {
          SubtractFrameOfReference<long>(this,this->delta_buffer,this->minimum_delta);
          this->total_size = this->total_size + 0x18;
          iVar2 = BitpackingPrimitives::GetRequiredSize(this->compression_buffer_idx,width);
          this->total_size = this->total_size + iVar2;
          return true;
        }
      }
      if (this->can_do_for == true) {
        width_00 = BitpackingPrimitives::MinimumBitWidth<long,false>(this->min_max_diff);
        SubtractFrameOfReference<long>(this,this->compression_buffer,this->minimum);
        iVar2 = BitpackingPrimitives::GetRequiredSize(this->compression_buffer_idx,width_00);
        this->total_size = iVar2 + this->total_size + 0x10;
      }
      else {
        bVar3 = false;
      }
    }
    else {
      this->total_size = this->total_size + 0xc;
    }
  }
  return bVar3;
}

Assistant:

bool Flush() {
		if (compression_buffer_idx == 0) {
			return true;
		}

		if ((all_invalid || maximum == minimum) && (mode == BitpackingMode::AUTO || mode == BitpackingMode::CONSTANT)) {
			OP::WriteConstant(maximum, compression_buffer_idx, data_ptr, all_invalid);
			total_size += sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
			return true;
		}

		CalculateFORStats();
		CalculateDeltaStats();

		if (can_do_delta) {
			if (maximum_delta == minimum_delta && mode != BitpackingMode::FOR && mode != BitpackingMode::DELTA_FOR) {
				// FOR needs to be T (considering hugeint is bigger than idx_t)
				T frame_of_reference = compression_buffer[0];

				OP::WriteConstantDelta(maximum_delta, static_cast<T>(frame_of_reference), compression_buffer_idx,
				                       compression_buffer, compression_buffer_validity, data_ptr);
				total_size += sizeof(T) + sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
				return true;
			}

			// Check if delta has benefit
			auto delta_required_bitwidth =
			    BitpackingPrimitives::MinimumBitWidth<T, false>(static_cast<T>(min_max_delta_diff));
			auto regular_required_bitwidth = BitpackingPrimitives::MinimumBitWidth(min_max_diff);

			if (delta_required_bitwidth < regular_required_bitwidth && mode != BitpackingMode::FOR) {
				SubtractFrameOfReference(delta_buffer, minimum_delta);

				OP::WriteDeltaFor(reinterpret_cast<T *>(delta_buffer), compression_buffer_validity,
				                  delta_required_bitwidth, static_cast<T>(minimum_delta), delta_offset,
				                  compression_buffer, compression_buffer_idx, data_ptr);

				// FOR (frame of reference).
				total_size += sizeof(T);
				// Aligned bitpacking width.
				total_size += AlignValue(sizeof(bitpacking_width_t));
				// Delta offset.
				total_size += sizeof(T);
				// Compressed data size.
				total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, delta_required_bitwidth);

				return true;
			}
		}

		if (can_do_for) {
			auto width = BitpackingPrimitives::MinimumBitWidth<T, false>(min_max_diff);
			SubtractFrameOfReference(compression_buffer, minimum);
			OP::WriteFor(compression_buffer, compression_buffer_validity, width, minimum, compression_buffer_idx,
			             data_ptr);

			total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, width);
			total_size += sizeof(T); // FOR value
			total_size += AlignValue(sizeof(bitpacking_width_t));

			return true;
		}

		return false;
	}